

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall
cmCTest::SetCTestConfigurationFromCMakeVariable
          (cmCTest *this,cmMakefile *mf,char *dconfig,string *cmake_var,bool suppress)

{
  char *value;
  size_t sVar1;
  ostream *poVar2;
  ostringstream cmCTestLog_msg;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  value = cmMakefile::GetDefinition(mf,cmake_var);
  if (value != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"SetCTestConfigurationFromCMakeVariable:",0x27);
    if (dconfig == (char *)0x0) {
      std::ios::clear((int)(_func_int *)
                           ((long)local_1c8 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x20
                     );
    }
    else {
      sVar1 = strlen(dconfig);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,dconfig,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(cmake_var->_M_dataplus)._M_p,
                        cmake_var->_M_string_length);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0xb72,(char *)local_1c8[0],suppress);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    SetCTestConfiguration(this,dconfig,value,suppress);
  }
  return value != (char *)0x0;
}

Assistant:

bool cmCTest::SetCTestConfigurationFromCMakeVariable(cmMakefile* mf,
  const char* dconfig, const std::string& cmake_var, bool suppress)
{
  const char* ctvar;
  ctvar = mf->GetDefinition(cmake_var);
  if ( !ctvar )
    {
    return false;
    }
  cmCTestOptionalLog(this, HANDLER_VERBOSE_OUTPUT,
    "SetCTestConfigurationFromCMakeVariable:" << dconfig << ":" <<
    cmake_var << std::endl, suppress);
  this->SetCTestConfiguration(dconfig, ctvar, suppress);
  return true;
}